

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatTerm.cpp
# Opt level: O1

void __thiscall Kernel::FlatTerm::destroy(FlatTerm *this)

{
  ulong uVar1;
  
  uVar1 = this->_length * 8 + 0x17 & 0xfffffffffffffff0;
  if (uVar1 == 0) {
    this->_length = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = this;
    return;
  }
  if (uVar1 < 0x11) {
    this->_length = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = this;
    return;
  }
  if (uVar1 < 0x19) {
    this->_length = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = this;
    return;
  }
  if (uVar1 < 0x21) {
    this->_length = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = this;
    return;
  }
  if (uVar1 < 0x31) {
    this->_length = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = this;
    return;
  }
  if (uVar1 < 0x41) {
    this->_length = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = this;
    return;
  }
  operator_delete(this,0x10);
  return;
}

Assistant:

void FlatTerm::destroy()
{
  ASS_GE(_length,0);

  //one entry is already accounted for in the size of the FlatTerm object
  size_t size = sizeof(FlatTerm);
  if (_length > 0) {
    size += (_length-1)*sizeof(Entry);
  }

  DEALLOC_KNOWN(this, size,"FlatTerm");
}